

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

int prefix_f2(pt_ild *ild,uint8_t length,uint8_t rex)

{
  uint8_t rex_local;
  uint8_t length_local;
  pt_ild *ild_local;
  
  if (ild == (pt_ild *)0x0) {
    ild_local._4_4_ = -1;
  }
  else {
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xffef | 0x10;
    *(ushort *)&ild->field_0x10 = *(ushort *)&ild->field_0x10 & 0xff9f | 0x40;
    ild_local._4_4_ = prefix_next(ild,length,'\0');
  }
  return ild_local._4_4_;
}

Assistant:

static int prefix_f2(struct pt_ild *ild, uint8_t length, uint8_t rex)
{
	(void) rex;

	if (!ild)
		return -pte_internal;

	ild->f2 = 1;
	ild->last_f2f3 = 2;

	return prefix_next(ild, length, 0);
}